

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * CTcPrsOpUnary::parse_embedding(CTcEmbedBuilder *b)

{
  CTcPrsNode *pCVar1;
  int eos;
  char *open_kw;
  CTcEmbedLevel level;
  int local_44;
  char *local_40;
  CTcEmbedLevel local_38;
  
  while( true ) {
    local_38.typ = 0;
    local_38.parent = (CTcEmbedLevel *)0x0;
    pCVar1 = parse_embedding_list(b,&local_44,&local_38);
    if ((pCVar1 == (CTcPrsNode *)0x0) || (local_44 != 0)) break;
    parse_embedded_end_tok(b,&local_38,&local_40);
    CTcTokenizer::log_error
              (0x2bdc,(ulong)(uint)(G_tok->curtok_).text_len_,(G_tok->curtok_).text_,local_40);
  }
  return pCVar1;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_embedding(CTcEmbedBuilder *b)
{
    /* keep going until we reach the end of the string */
    for (;;)
    {
        /* parse a series of embeddings */
        int eos;
        CTcEmbedLevel level(CTcEmbedLevel::Outer, 0);
        CTcPrsNode *n = parse_embedding_list(b, eos, &level);

        /* if we encountered an error or the end of the string, we're done */
        if (n == 0 || eos)
            return n;

        /* 
         *   We stopped parsing without reaching the end of the string, so we
         *   must have encountered a token that terminates a nested structure
         *   - <<end>>, <<else>>, <<case>>, etc.  Capture the current
         *   embedding so we can check which type of end token it is.  
         */
        const char *open_kw;
        parse_embedded_end_tok(b, &level, &open_kw);
        G_tok->log_error(TCERR_BAD_EMBED_END_TOK,
                         (int)G_tok->getcur()->get_text_len(),
                         G_tok->getcur()->get_text(), open_kw);
    }
}